

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

size_t __thiscall
capnp::computeSerializedSizeInWords
          (capnp *this,ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  long lVar3;
  Fault f;
  Fault local_10;
  
  pAVar2 = segments.ptr;
  if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
    sVar1 = ((ulong)pAVar2 >> 1) + 1;
    for (lVar3 = (long)pAVar2 << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
      sVar1 = sVar1 + *(long *)(this + 8);
      this = this + 0x10;
    }
    return sVar1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0xa0,FAILED,"segments.size() > 0","\"Tried to serialize uninitialized message.\"",
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

size_t computeSerializedSizeInWords(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  size_t totalSize = segments.size() / 2 + 1;

  for (auto& segment: segments) {
    totalSize += segment.size();
  }

  return totalSize;
}